

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_circuit.cpp
# Opt level: O2

pin_t __thiscall lsim::SimCircuit::pin_from_pin_id(SimCircuit *this,pin_id_t pin_id)

{
  pin_t pVar1;
  iterator iVar2;
  key_type_conflict1 local_c;
  
  local_c = (key_type_conflict1)(pin_id >> 0x20);
  iVar2 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_lsim::SimComponent_*>,_std::allocator<std::pair<const_unsigned_int,_lsim::SimComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->m_components)._M_h,&local_c);
  if (iVar2.super__Node_iterator_base<std::pair<const_unsigned_int,_lsim::SimComponent_*>,_false>.
      _M_cur == (__node_type *)0x0) {
    pVar1 = 0xffffffff;
  }
  else {
    pVar1 = SimComponent::pin_by_index
                      (*(SimComponent **)
                        ((long)iVar2.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_lsim::SimComponent_*>,_false>
                               ._M_cur + 0x10),(uint32_t)pin_id);
  }
  return pVar1;
}

Assistant:

pin_t SimCircuit::pin_from_pin_id(pin_id_t pin_id) {

    auto found = m_components.find(component_id_from_pin_id(pin_id));
    if (found == m_components.end()) {
        return PIN_UNDEFINED;
    }

    return found->second->pin_by_index(pin_index_from_pin_id(pin_id));
}